

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_SecureChannel_deleteMembersCleanup(UA_SecureChannel *channel)

{
  SessionEntry *pSVar1;
  SessionEntry **ppSVar2;
  ChunkEntry *pCVar3;
  ChunkEntry *pCVar4;
  ChunkEntry **ppCVar5;
  ChunkEntry *__ptr;
  SessionEntry *__ptr_00;
  
  UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->serverAsymAlgSettings);
  UA_ByteString_deleteMembers(&channel->serverNonce);
  UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->clientAsymAlgSettings);
  UA_ByteString_deleteMembers(&channel->clientNonce);
  if (channel->connection != (UA_Connection *)0x0) {
    UA_Connection_detachSecureChannel(channel->connection);
  }
  __ptr_00 = (channel->sessions).lh_first;
  while (__ptr_00 != (SessionEntry *)0x0) {
    pSVar1 = (__ptr_00->pointers).le_next;
    if (__ptr_00->session != (UA_Session *)0x0) {
      __ptr_00->session->channel = (UA_SecureChannel *)0x0;
    }
    ppSVar2 = (__ptr_00->pointers).le_prev;
    if (pSVar1 != (SessionEntry *)0x0) {
      (pSVar1->pointers).le_prev = ppSVar2;
    }
    *ppSVar2 = pSVar1;
    free(__ptr_00);
    __ptr_00 = pSVar1;
  }
  __ptr = (channel->chunks).lh_first;
  while (__ptr != (ChunkEntry *)0x0) {
    pCVar3 = (__ptr->pointers).le_next;
    UA_ByteString_deleteMembers(&__ptr->bytes);
    pCVar4 = (__ptr->pointers).le_next;
    ppCVar5 = (__ptr->pointers).le_prev;
    if (pCVar4 != (ChunkEntry *)0x0) {
      (pCVar4->pointers).le_prev = ppCVar5;
    }
    *ppCVar5 = pCVar4;
    free(__ptr);
    __ptr = pCVar3;
  }
  return;
}

Assistant:

void UA_SecureChannel_deleteMembersCleanup(UA_SecureChannel *channel) {
    /* Delete members */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->serverAsymAlgSettings);
    UA_ByteString_deleteMembers(&channel->serverNonce);
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->clientAsymAlgSettings);
    UA_ByteString_deleteMembers(&channel->clientNonce);
    UA_ChannelSecurityToken_deleteMembers(&channel->securityToken);
    UA_ChannelSecurityToken_deleteMembers(&channel->nextSecurityToken);

    /* Detach from the channel */
    if(channel->connection)
        UA_Connection_detachSecureChannel(channel->connection);

    /* Remove session pointers (not the sessions) */
    struct SessionEntry *se, *temp;
    LIST_FOREACH_SAFE(se, &channel->sessions, pointers, temp) {
        if(se->session)
            se->session->channel = NULL;
        LIST_REMOVE(se, pointers);
        UA_free(se);
    }

    /* Remove the buffered chunks */
    struct ChunkEntry *ch, *temp_ch;
    LIST_FOREACH_SAFE(ch, &channel->chunks, pointers, temp_ch) {
        UA_ByteString_deleteMembers(&ch->bytes);
        LIST_REMOVE(ch, pointers);
        UA_free(ch);
    }
}